

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_sort_int(kvtree *hash,int direction)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  int iVar3;
  int iVar4;
  sort_elem_int *__base;
  anon_struct_16_2_6a822a49_for_pointers *paVar5;
  kvtree_elem **ppkVar6;
  code *__compar;
  kvtree_elem_struct *pkVar7;
  long lVar8;
  sort_elem_int *list;
  
  iVar3 = kvtree_size(hash);
  __base = (sort_elem_int *)
           kvtree_malloc((long)iVar3 << 4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x26b);
  lVar8 = 0;
  pkVar7 = (kvtree_elem *)0x0;
  paVar5 = (anon_struct_16_2_6a822a49_for_pointers *)hash;
  list = __base;
  if (hash == (kvtree *)0x0) goto LAB_00104350;
  while( true ) {
    pkVar7 = paVar5->le_next;
LAB_00104350:
    if (pkVar7 == (kvtree_elem *)0x0) break;
    iVar4 = kvtree_elem_key_int(pkVar7);
    __base[lVar8].key = iVar4;
    __base[lVar8].addr = pkVar7;
    lVar8 = lVar8 + 1;
    paVar5 = &pkVar7->pointers;
  }
  __compar = kvtree_cmp_fn_int_asc;
  if (direction == 1) {
    __compar = kvtree_cmp_fn_int_desc;
  }
  qsort(__base,(long)iVar3,0x10,__compar);
  ppkVar6 = &__base[lVar8 + -1].addr;
  for (; 0 < lVar8; lVar8 = lVar8 + -1) {
    pkVar7 = *ppkVar6;
    pkVar1 = (pkVar7->pointers).le_next;
    ppkVar2 = (pkVar7->pointers).le_prev;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = ppkVar2;
    }
    *ppkVar2 = pkVar1;
    pkVar1 = hash->lh_first;
    (pkVar7->pointers).le_next = pkVar1;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = &(pkVar7->pointers).le_next;
    }
    hash->lh_first = pkVar7;
    (pkVar7->pointers).le_prev = &hash->lh_first;
    ppkVar6 = ppkVar6 + -2;
  }
  kvtree_free(&list);
  return 0;
}

Assistant:

int kvtree_sort_int(kvtree* hash, int direction)
{
  /* get the size of the hash */
  int count = kvtree_size(hash);

  /* allocate space for each element */
  struct sort_elem_int* list = (struct sort_elem_int*) KVTREE_MALLOC(count * sizeof(struct sort_elem_int));

  /* walk the hash and fill in the keys */
  kvtree_elem* elem = NULL;
  int index = 0;
  for (elem = kvtree_elem_first(hash);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    int key = kvtree_elem_key_int(elem);
    list[index].key = key;
    list[index].addr = elem;
    index++;
  }

  /* sort the elements by key */
  int (*fn)(const void* a, const void* b) = NULL;
  fn = &kvtree_cmp_fn_int_asc;
  if (direction == KVTREE_SORT_DESCENDING) {
    fn = &kvtree_cmp_fn_int_desc;
  }
  qsort(list, count, sizeof(struct sort_elem_int), fn);

  /* walk the sorted list backwards, extracting the element by address,
   * and inserting at the head */
  while (index > 0) {
    index--;
    elem = list[index].addr;
    LIST_REMOVE(elem, pointers);
    LIST_INSERT_HEAD(hash, elem, pointers);
  }

  /* free the list */
  kvtree_free(&list);

  return KVTREE_SUCCESS;
}